

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O0

string * format_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char *pcVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char *local_68;
  char *new_buffer_ptr;
  int return_value;
  uint loop_count;
  bool done;
  char *pcStack_50;
  char *buffer;
  size_t local_40;
  size_t buffer_size_bytes;
  va_list ap;
  char *format_local;
  string *result;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_40 = 0x100;
  buffer._7_1_ = 0;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcStack_50 = (char *)malloc(local_40);
  if (pcStack_50 != (char *)0x0) {
    return_value._3_1_ = 0;
    new_buffer_ptr._4_4_ = 0;
    while (((return_value._3_1_ ^ 0xff) & 1) != 0) {
      ap[0].overflow_arg_area = local_128;
      ap[0]._0_8_ = &stack0x00000008;
      buffer_size_bytes._4_4_ = 0x30;
      buffer_size_bytes._0_4_ = 0x10;
      new_buffer_ptr._0_4_ = vsnprintf(pcStack_50,local_40,format,&buffer_size_bytes);
      if ((int)new_buffer_ptr < 0) {
        return_value._3_1_ = 1;
        pcVar1 = pcStack_50;
      }
      else if ((ulong)(long)(int)new_buffer_ptr < local_40) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcStack_50);
        return_value._3_1_ = 1;
        pcVar1 = pcStack_50;
      }
      else {
        local_40 = (size_t)((int)new_buffer_ptr + 1);
        local_68 = (char *)realloc(pcStack_50,local_40);
        pcVar1 = local_68;
        if (local_68 == (char *)0x0) {
          return_value._3_1_ = 1;
          pcVar1 = pcStack_50;
        }
      }
      pcStack_50 = pcVar1;
      new_buffer_ptr._4_4_ = new_buffer_ptr._4_4_ + 1;
      if (5 < new_buffer_ptr._4_4_) {
        return_value._3_1_ = 1;
      }
    }
    free(pcStack_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string
format(const char* format, ...)
{
    va_list ap;

    size_t buffer_size_bytes = 256;

    string result;

    char* buffer = (char*)malloc(buffer_size_bytes);

    if( buffer == NULL )
        return result;

    bool done = false;

    unsigned int loop_count = 0;

    while(!done)
    {
        va_start(ap, format);

        int return_value = vsnprintf(buffer, buffer_size_bytes, format, ap);

        if( return_value < 0 )
        {
            done = true;
        }
        else if( return_value >= buffer_size_bytes )
        {
            // Realloc and try again.

            buffer_size_bytes = return_value + 1;

            char* new_buffer_ptr = (char*)realloc(buffer, buffer_size_bytes);

            if( new_buffer_ptr == NULL )
            {
                done = true;
            }
            else
            {
                buffer = new_buffer_ptr;
            }
        }
        else
        {
            result = buffer;
            done = true;
        }

        va_end(ap);

        if( ++loop_count > 5 )
            done = true;
    }

    free(buffer);

    return result;
}